

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O3

char * __thiscall
Memory::HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
::TryAlloc(HeapBucketT<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
           *this,Recycler *recycler,TBlockAllocatorType *allocator,size_t sizeCat,
          ObjectInfoBits attributes)

{
  SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *heapBlock;
  SmallHeapBlockT<MediumAllocationBlockAttributes> *this_00;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *pSVar4;
  char *pcVar5;
  undefined2 in_register_00000082;
  AutoFilterExceptionRegion local_34 [2];
  AutoFilterExceptionRegion __autoFilterExceptionRegion;
  
  AutoFilterExceptionRegion::AutoFilterExceptionRegion(local_34,ExceptionType_All);
  if (0x3ff < CONCAT22(in_register_00000082,attributes)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x1e1,"((attributes & InternalObjectInfoBitMask) == attributes)",
                       "(attributes & InternalObjectInfoBitMask) == attributes");
    if (!bVar2) goto LAB_006cfda1;
    *puVar3 = 0;
  }
  SmallHeapBlockAllocator<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
  ::Clear(allocator);
  heapBlock = this->nextAllocableBlockHead;
  if (heapBlock == (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
    if (this->explicitFreeList != (FreeObject *)0x0) {
      SmallHeapBlockAllocator<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
      ::SetExplicitFreeList(allocator,this->explicitFreeList);
      this->lastExplicitFreeListAllocator = allocator;
      this->explicitFreeList = (FreeObject *)0x0;
      goto LAB_006cfcb9;
    }
  }
  else {
    bVar2 = IsAllocationStopped(this);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                         ,0x21d,"(!this->IsAllocationStopped())","!this->IsAllocationStopped()");
      if (!bVar2) goto LAB_006cfda1;
      *puVar3 = 0;
    }
    this_00 = (heapBlock->super_SmallFinalizableHeapBlockT<MediumAllocationBlockAttributes>).
              super_SmallNormalHeapBlockT<MediumAllocationBlockAttributes>.
              super_SmallHeapBlockT<MediumAllocationBlockAttributes>.next;
    if (this_00 == (SmallHeapBlockT<MediumAllocationBlockAttributes> *)0x0) {
      pSVar4 = (SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes> *)0x0;
    }
    else {
      pSVar4 = HeapBlock::AsFinalizableWriteBarrierBlock<MediumAllocationBlockAttributes>
                         (&this_00->super_HeapBlock);
    }
    this->nextAllocableBlockHead = pSVar4;
    SmallHeapBlockAllocator<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
    ::Set(allocator,heapBlock);
LAB_006cfcb9:
    if (InternalObjectInfoBitMask < attributes) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallHeapBlockAllocator.h"
                         ,0xfe,"((attributes & InternalObjectInfoBitMask) == attributes)",
                         "(attributes & InternalObjectInfoBitMask) == attributes");
      if (!bVar2) goto LAB_006cfda1;
      *puVar3 = 0;
    }
    pcVar5 = SmallHeapBlockAllocator<Memory::SmallFinalizableWithBarrierHeapBlockT<MediumAllocationBlockAttributes>_>
             ::InlinedAllocImpl<false>(allocator,recycler,sizeCat,attributes);
    if (pcVar5 != (char *)0x0) goto LAB_006cfd86;
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x238,"(memBlock != nullptr)","memBlock != nullptr");
    if (!bVar2) {
LAB_006cfda1:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pcVar5 = (char *)0x0;
LAB_006cfd86:
  AutoFilterExceptionRegion::~AutoFilterExceptionRegion(local_34);
  return pcVar5;
}

Assistant:

char *
HeapBucketT<TBlockType>::TryAlloc(Recycler * recycler, TBlockAllocatorType * allocator, size_t sizeCat, ObjectInfoBits attributes)
{
    AUTO_NO_EXCEPTION_REGION;

    Assert((attributes & InternalObjectInfoBitMask) == attributes);

    ClearAllocator(allocator);

    TBlockType * heapBlock = this->nextAllocableBlockHead;
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP 
#if SUPPORT_WIN32_SLIST
    bool heapBlockFromAllocableHeapBlockList = false;
    DebugOnly(bool heapBlockInPendingSweepPrepList = false);

    if (heapBlock == nullptr && this->allocationsStartedDuringConcurrentSweep)
    {
#if DBG || defined(RECYCLER_SLOW_CHECK_ENABLED)
        // This lock is needed only in the debug mode while we verify block counts. Not needed otherwise, as this list is never accessed concurrently.
        // Items are added to it by the allocator when allocations are allowed during concurrent sweep. The list is drained during the next sweep while
        // allocation are stopped.
        debugSweepableHeapBlockListLock.Enter();
#endif
        heapBlock = PopHeapBlockFromSList(this->allocableHeapBlockListHead);
        if (heapBlock != nullptr)
        {
            Assert(!this->IsAnyFinalizableBucket());
            DebugOnly(this->AssertCheckHeapBlockNotInAnyList(heapBlock));
#if DBG || defined(RECYCLER_SLOW_CHECK_ENABLED)
            heapBlock->wasAllocatedFromDuringSweep = true;
#endif
#if DBG || defined(RECYCLER_TRACE)
            if (heapBlock->isPendingConcurrentSweepPrep)
            {
                AssertMsg(heapBlock->objectsAllocatedDuringConcurrentSweepCount == 0, "We just picked up this block for allocations during concurrent sweep, we haven't allocated from it yet.");

#ifdef RECYCLER_TRACE
                recycler->PrintBlockStatus(this, heapBlock, _u("[**31**] pending Pass1 prep, picked up for allocations during concurrent sweep."));
#endif
                DebugOnly(heapBlockInPendingSweepPrepList = true);
            }
            else
            {
                // Put the block in the sweepable heap block list so we don't lose track of it. The block will eventually be moved to the
                // heapBlockList or fullBlockList as appropriate during the next sweep.
                AssertMsg(!HeapBlockList::Contains(heapBlock, sweepableHeapBlockList), "The heap block already exists in this list.");

#ifdef RECYCLER_TRACE
                recycler->PrintBlockStatus(this, heapBlock, _u("[**32**] picked up for allocations during concurrent sweep."));
#endif
            }
#endif
            heapBlock->SetNextBlock(sweepableHeapBlockList);
            sweepableHeapBlockList = heapBlock;
            heapBlockFromAllocableHeapBlockList = true;
        }
#if DBG|| defined(RECYCLER_SLOW_CHECK_ENABLED)
        debugSweepableHeapBlockListLock.Leave();
#endif
    }
#endif
#endif

   if (heapBlock != nullptr)
   {
        Assert(!this->IsAllocationStopped());

#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP && SUPPORT_WIN32_SLIST
        // When allocations are allowed during concurrent sweep we set nextAllocableBlockHead to NULL as the allocator will pick heap blocks from the
        // interlocked SLIST. During that time, the heap block at the top of the SLIST is always the nextAllocableBlockHead.
        // If the heapBlock was just picked from the SLIST and nextAllocableBlockHead is not NULL then we just resumed normal allocations on the background thread
        // while finishing the concurrent sweep, and the nextAllocableBlockHead is already set properly.
        if (this->nextAllocableBlockHead != nullptr && !heapBlockFromAllocableHeapBlockList)
#endif
        {
            this->nextAllocableBlockHead = heapBlock->GetNextBlock();
        }

        allocator->Set(heapBlock);
    }
    else if (this->explicitFreeList != nullptr)
    {
        allocator->SetExplicitFreeList(this->explicitFreeList);
        this->lastExplicitFreeListAllocator = allocator;
        this->explicitFreeList = nullptr;
    }
    else
    {
        return nullptr;
    }
    // We just found a block we can allocate on
    char * memBlock = allocator->template SlowAlloc<false /* disallow fault injection */>(recycler, sizeCat, attributes);
    Assert(memBlock != nullptr);
    return memBlock;
}